

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonteCarloPricer.h
# Opt level: O3

PriceCI * __thiscall
MonteCarloPricer::price<AsianGeometricCall>
          (PriceCI *__return_storage_ptr__,MonteCarloPricer *this,BlackScholesModel *model,
          AsianGeometricCall *option)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  double dVar5;
  double dVar6;
  double local_50;
  undefined1 local_48 [16];
  double local_38;
  
  local_50 = Option::getMaturity((Option *)option);
  BlackScholesModel::generatePath(model,&local_50,this->prices_vector);
  iVar3 = this->num_sims;
  if (iVar3 < 1) {
    dVar6 = 0.0;
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    iVar4 = 0;
    dVar6 = 0.0;
    do {
      local_50 = Option::getMaturity((Option *)option);
      BlackScholesModel::generatePath(model,&local_50,this->prices_vector);
      (*(option->super_PathDependentOption).super_Option._vptr_Option[1])
                (option,this->prices_vector);
      dVar6 = dVar6 + (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      dVar5 = dVar5 + (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) *
                      (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      iVar4 = iVar4 + 1;
      iVar3 = this->num_sims;
    } while (iVar4 < iVar3);
  }
  dVar6 = dVar6 / (double)iVar3;
  dVar1 = BlackScholesModel::getRiskFreeRate(model);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = -dVar1;
  local_48._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
  dVar1 = Option::getMaturity((Option *)option);
  local_50 = exp(dVar1 * (double)local_48._0_8_);
  local_50 = local_50 * dVar6;
  dVar1 = BlackScholesModel::getRiskFreeRate(model);
  dVar2 = Option::getMaturity((Option *)option);
  local_38 = exp(dVar2 * dVar1 * -2.0);
  local_38 = local_38 * (dVar5 / (double)iVar3 - dVar6 * dVar6);
  PriceCI::PriceCI(__return_storage_ptr__,&local_50,&local_38,&this->num_sims);
  return __return_storage_ptr__;
}

Assistant:

inline PriceCI MonteCarloPricer::price(BlackScholesModel const& model, T const& option)
{
	model.generatePath(option.getMaturity(), *prices_vector);

	double payoff, payoff_sum = 0.0, payoff_sq_mean = 0.0;
	for (int i = 0; i < num_sims; i++) {
		model.generatePath(option.getMaturity(), *prices_vector);
		payoff = option.payoff(*prices_vector);
		payoff_sum += payoff;
		payoff_sq_mean += payoff * payoff;
	}
	double payoff_mean = payoff_sum / static_cast<double>(num_sims);
	double payoff_std = (payoff_sq_mean / static_cast<double>(num_sims)) - payoff_mean * payoff_mean;
	payoff_mean *= exp(-model.getRiskFreeRate() * option.getMaturity());
	payoff_std *= exp(-2 * model.getRiskFreeRate() * option.getMaturity());
	return { payoff_mean, payoff_std, num_sims };
}